

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatadst.c
# Opt level: O0

void jpeg_stdio_dest(j_compress_ptr cinfo,FILE *outfile)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 in_RSI;
  long in_RDI;
  my_dest_ptr dest;
  
  if (*(long *)(in_RDI + 0x28) == 0) {
    uVar2 = (*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,0,0x38);
    *(undefined8 *)(in_RDI + 0x28) = uVar2;
  }
  lVar1 = *(long *)(in_RDI + 0x28);
  *(code **)(lVar1 + 0x10) = init_destination;
  *(code **)(lVar1 + 0x18) = empty_output_buffer;
  *(code **)(lVar1 + 0x20) = term_destination;
  *(undefined8 *)(lVar1 + 0x28) = in_RSI;
  return;
}

Assistant:

GLOBAL(void)
jpeg_stdio_dest (j_compress_ptr cinfo, FILE * outfile)
{
  my_dest_ptr dest;

  /* The destination object is made permanent so that multiple JPEG images
   * can be written to the same file without re-executing jpeg_stdio_dest.
   * This makes it dangerous to use this manager and a different destination
   * manager serially with the same JPEG object, because their private object
   * sizes may be different.  Caveat programmer.
   */
  if (cinfo->dest == NULL) {	/* first time for this JPEG object? */
    cinfo->dest = (struct jpeg_destination_mgr *)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_PERMANENT,
				  SIZEOF(my_destination_mgr));
  }

  dest = (my_dest_ptr) cinfo->dest;
  dest->pub.init_destination = init_destination;
  dest->pub.empty_output_buffer = empty_output_buffer;
  dest->pub.term_destination = term_destination;
  dest->outfile = outfile;
}